

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_begin_int_byname(char *attr_name,int val)

{
  allocator<char> local_69;
  string local_68;
  Attribute attr;
  Caliper c;
  
  cali::Caliper::Caliper(&c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,attr_name,&local_69);
  attr = cali::Caliper::create_attribute
                   (&c,&local_68,CALI_TYPE_INT,0,0,(Attribute *)0x0,(Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_68);
  local_68._M_string_length = (size_type)val;
  local_68._M_dataplus._M_p = (pointer)0x2;
  cali::Caliper::begin(&c,&attr,(Variant *)&local_68);
  return;
}

Assistant:

void cali_begin_int_byname(const char* attr_name, int val)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_INT, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(val));
}